

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void free_multi_response(void *client_data)

{
  void *in_RDI;
  response_instance_conflict resp;
  
  *(int *)((long)in_RDI + 0x10) = *(int *)((long)in_RDI + 0x10) + -1;
  if (*(int *)((long)in_RDI + 0x10) == 0) {
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      cod_code_free(*(undefined8 *)((long)in_RDI + 0x18));
    }
    if (*(long *)((long)in_RDI + 0x20) != 0) {
      cod_exec_context_free(*(undefined8 *)((long)in_RDI + 0x20));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

static void
free_multi_response(void *client_data)
{
    response_instance resp = (response_instance) client_data;
    resp->u.queued.ref_count--;
    if (resp->u.queued.ref_count != 0) return;
    if (resp->u.queued.code) cod_code_free(resp->u.queued.code);
    if (resp->u.queued.ec) cod_exec_context_free(resp->u.queued.ec);
    free(resp);
}